

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.cc
# Opt level: O2

vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *
upb::generator::SortedMessages
          (vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *__return_storage_ptr__,
          FileDefPtr file)

{
  int iVar1;
  MessageDefPtr message;
  int i;
  int i_00;
  
  (__return_storage_ptr__->
  super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  i_00 = 0;
  while( true ) {
    iVar1 = upb_FileDef_TopLevelMessageCount(file.ptr_);
    if (iVar1 <= i_00) break;
    message.ptr_ = upb_FileDef_TopLevelMessage(file.ptr_,i_00);
    AddMessages(message,__return_storage_ptr__);
    i_00 = i_00 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<upb::MessageDefPtr> SortedMessages(upb::FileDefPtr file) {
  std::vector<upb::MessageDefPtr> messages;
  for (int i = 0; i < file.toplevel_message_count(); i++) {
    AddMessages(file.toplevel_message(i), &messages);
  }
  return messages;
}